

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

void __thiscall
cmsys::SystemInformationImplementation::TrimNewline
          (SystemInformationImplementation *this,string *output)

{
  ulong uVar1;
  size_type pos;
  string *output_local;
  SystemInformationImplementation *this_local;
  
  while (uVar1 = std::__cxx11::string::find((char *)output,0x970517), uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)output,uVar1);
  }
  while (uVar1 = std::__cxx11::string::find((char *)output,0x9a3a29), uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)output,uVar1);
  }
  return;
}

Assistant:

void SystemInformationImplementation::TrimNewline(kwsys_stl::string& output)
{
  // remove \r
  kwsys_stl::string::size_type pos=0;
  while((pos = output.find("\r", pos)) != kwsys_stl::string::npos)
    {
    output.erase(pos);
    }

  // remove \n
  pos = 0;
  while((pos = output.find("\n", pos)) != kwsys_stl::string::npos)
    {
    output.erase(pos);
    }
}